

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

bool Imath_3_2::findEntryAndExitPoints<float>
               (Line3<float> *r,Box<Imath_3_2::Vec3<float>_> *b,Vec3<float> *entry,Vec3<float> *exit
               )

{
  float *pfVar1;
  bool bVar2;
  float *in_RCX;
  float *in_RDX;
  Box<Imath_3_2::Vec3<float>_> *in_RSI;
  float *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float t2_5;
  float t1_5;
  float d2_5;
  float d1_5;
  float t2_4;
  float t1_4;
  float d2_4;
  float d1_4;
  float t2_3;
  float t1_3;
  float d2_3;
  float d1_3;
  float t2_2;
  float t1_2;
  float d2_2;
  float d1_2;
  float t2_1;
  float t1_1;
  float d2_1;
  float d1_1;
  float t2;
  float t1;
  float d2;
  float d1;
  float tBackMin;
  float tFrontMax;
  float TMAX;
  float local_34;
  float local_30;
  bool local_1;
  
  bVar2 = Box<Imath_3_2::Vec3<float>_>::isEmpty(in_RSI);
  if (bVar2) {
    local_1 = false;
  }
  else {
    std::numeric_limits<float>::max();
    local_30 = -3.4028235e+38;
    local_34 = 3.4028235e+38;
    if (in_RDI[3] < 0.0) {
      fVar3 = (in_RSI->min).x - *in_RDI;
      fVar4 = (in_RSI->max).x - *in_RDI;
      if ((in_RDI[3] <= -1.0 && in_RDI[3] != -1.0) ||
         ((fVar5 = abs<float>(fVar3), fVar5 < in_RDI[3] * -3.4028235e+38 &&
          (fVar5 = abs<float>(fVar4), fVar5 < in_RDI[3] * -3.4028235e+38)))) {
        fVar3 = fVar3 / in_RDI[3];
        fVar4 = fVar4 / in_RDI[3];
        if (fVar3 < 3.4028235e+38) {
          *in_RCX = (in_RSI->min).x;
          fVar5 = clamp<float>(fVar3 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RCX[1] = fVar5;
          fVar5 = clamp<float>(fVar3 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RCX[2] = fVar5;
          local_34 = fVar3;
        }
        if (-3.4028235e+38 < fVar4) {
          *in_RDX = (in_RSI->max).x;
          fVar3 = clamp<float>(fVar4 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RDX[1] = fVar3;
          fVar3 = clamp<float>(fVar4 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RDX[2] = fVar3;
          local_30 = fVar4;
        }
      }
      else if ((*in_RDI < (in_RSI->min).x) ||
              ((in_RSI->max).x <= *in_RDI && *in_RDI != (in_RSI->max).x)) {
        return false;
      }
    }
    else {
      fVar3 = (in_RSI->max).x - *in_RDI;
      fVar4 = (in_RSI->min).x - *in_RDI;
      if ((1.0 < in_RDI[3]) ||
         ((fVar5 = abs<float>(fVar3), fVar5 < in_RDI[3] * 3.4028235e+38 &&
          (fVar5 = abs<float>(fVar4), fVar5 < in_RDI[3] * 3.4028235e+38)))) {
        fVar3 = fVar3 / in_RDI[3];
        fVar4 = fVar4 / in_RDI[3];
        if (fVar3 < 3.4028235e+38) {
          *in_RCX = (in_RSI->max).x;
          fVar5 = clamp<float>(fVar3 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RCX[1] = fVar5;
          fVar5 = clamp<float>(fVar3 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RCX[2] = fVar5;
          local_34 = fVar3;
        }
        if (-3.4028235e+38 < fVar4) {
          *in_RDX = (in_RSI->min).x;
          fVar3 = clamp<float>(fVar4 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RDX[1] = fVar3;
          fVar3 = clamp<float>(fVar4 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RDX[2] = fVar3;
          local_30 = fVar4;
        }
      }
      else if ((*in_RDI < (in_RSI->min).x) ||
              ((in_RSI->max).x <= *in_RDI && *in_RDI != (in_RSI->max).x)) {
        return false;
      }
    }
    if (in_RDI[4] < 0.0) {
      fVar3 = (in_RSI->min).y - in_RDI[1];
      fVar4 = (in_RSI->max).y - in_RDI[1];
      if ((in_RDI[4] <= -1.0 && in_RDI[4] != -1.0) ||
         ((fVar5 = abs<float>(fVar3), fVar5 < in_RDI[4] * -3.4028235e+38 &&
          (fVar5 = abs<float>(fVar4), fVar5 < in_RDI[4] * -3.4028235e+38)))) {
        fVar3 = fVar3 / in_RDI[4];
        fVar4 = fVar4 / in_RDI[4];
        if (fVar3 < local_34) {
          fVar5 = clamp<float>(fVar3 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RCX = fVar5;
          in_RCX[1] = (in_RSI->min).y;
          fVar5 = clamp<float>(fVar3 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RCX[2] = fVar5;
          local_34 = fVar3;
        }
        if (local_30 < fVar4) {
          fVar3 = clamp<float>(fVar4 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RDX = fVar3;
          in_RDX[1] = (in_RSI->max).y;
          fVar3 = clamp<float>(fVar4 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RDX[2] = fVar3;
          local_30 = fVar4;
        }
      }
      else if ((in_RDI[1] < (in_RSI->min).y) ||
              (pfVar1 = &(in_RSI->max).y, *pfVar1 <= in_RDI[1] && in_RDI[1] != *pfVar1)) {
        return false;
      }
    }
    else {
      fVar3 = (in_RSI->max).y - in_RDI[1];
      fVar4 = (in_RSI->min).y - in_RDI[1];
      if ((1.0 < in_RDI[4]) ||
         ((fVar5 = abs<float>(fVar3), fVar5 < in_RDI[4] * 3.4028235e+38 &&
          (fVar5 = abs<float>(fVar4), fVar5 < in_RDI[4] * 3.4028235e+38)))) {
        fVar3 = fVar3 / in_RDI[4];
        fVar4 = fVar4 / in_RDI[4];
        if (fVar3 < local_34) {
          fVar5 = clamp<float>(fVar3 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RCX = fVar5;
          in_RCX[1] = (in_RSI->max).y;
          fVar5 = clamp<float>(fVar3 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RCX[2] = fVar5;
          local_34 = fVar3;
        }
        if (local_30 < fVar4) {
          fVar3 = clamp<float>(fVar4 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RDX = fVar3;
          in_RDX[1] = (in_RSI->min).y;
          fVar3 = clamp<float>(fVar4 * in_RDI[5] + in_RDI[2],(in_RSI->min).z,(in_RSI->max).z);
          in_RDX[2] = fVar3;
          local_30 = fVar4;
        }
      }
      else if ((in_RDI[1] < (in_RSI->min).y) ||
              (pfVar1 = &(in_RSI->max).y, *pfVar1 <= in_RDI[1] && in_RDI[1] != *pfVar1)) {
        return false;
      }
    }
    if (in_RDI[5] < 0.0) {
      fVar3 = (in_RSI->min).z - in_RDI[2];
      fVar4 = (in_RSI->max).z - in_RDI[2];
      if ((in_RDI[5] <= -1.0 && in_RDI[5] != -1.0) ||
         ((fVar5 = abs<float>(fVar3), fVar5 < in_RDI[5] * -3.4028235e+38 &&
          (fVar5 = abs<float>(fVar4), fVar5 < in_RDI[5] * -3.4028235e+38)))) {
        fVar3 = fVar3 / in_RDI[5];
        fVar4 = fVar4 / in_RDI[5];
        if (fVar3 < local_34) {
          fVar5 = clamp<float>(fVar3 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RCX = fVar5;
          fVar5 = clamp<float>(fVar3 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RCX[1] = fVar5;
          in_RCX[2] = (in_RSI->min).z;
          local_34 = fVar3;
        }
        if (local_30 < fVar4) {
          fVar3 = clamp<float>(fVar4 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RDX = fVar3;
          fVar3 = clamp<float>(fVar4 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RDX[1] = fVar3;
          in_RDX[2] = (in_RSI->max).z;
          local_30 = fVar4;
        }
      }
      else if ((in_RDI[2] < (in_RSI->min).z) ||
              (pfVar1 = &(in_RSI->max).z, *pfVar1 <= in_RDI[2] && in_RDI[2] != *pfVar1)) {
        return false;
      }
    }
    else {
      fVar3 = (in_RSI->max).z - in_RDI[2];
      fVar4 = (in_RSI->min).z - in_RDI[2];
      if ((1.0 < in_RDI[5]) ||
         ((fVar5 = abs<float>(fVar3), fVar5 < in_RDI[5] * 3.4028235e+38 &&
          (fVar5 = abs<float>(fVar4), fVar5 < in_RDI[5] * 3.4028235e+38)))) {
        fVar3 = fVar3 / in_RDI[5];
        fVar4 = fVar4 / in_RDI[5];
        if (fVar3 < local_34) {
          fVar5 = clamp<float>(fVar3 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RCX = fVar5;
          fVar5 = clamp<float>(fVar3 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RCX[1] = fVar5;
          in_RCX[2] = (in_RSI->max).z;
          local_34 = fVar3;
        }
        if (local_30 < fVar4) {
          fVar3 = clamp<float>(fVar4 * in_RDI[3] + *in_RDI,(in_RSI->min).x,(in_RSI->max).x);
          *in_RDX = fVar3;
          fVar3 = clamp<float>(fVar4 * in_RDI[4] + in_RDI[1],(in_RSI->min).y,(in_RSI->max).y);
          in_RDX[1] = fVar3;
          in_RDX[2] = (in_RSI->min).z;
          local_30 = fVar4;
        }
      }
      else if ((in_RDI[2] < (in_RSI->min).z) ||
              (pfVar1 = &(in_RSI->max).z, *pfVar1 <= in_RDI[2] && in_RDI[2] != *pfVar1)) {
        return false;
      }
    }
    local_1 = local_30 <= local_34;
  }
  return local_1;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 bool
findEntryAndExitPoints (
    const Line3<T>& r, const Box<Vec3<T>>& b, Vec3<T>& entry, Vec3<T>& exit)
    IMATH_NOEXCEPT
{
    if (b.isEmpty ())
    {
        //
        // No ray intersects an empty box
        //

        return false;
    }

    //
    // The following description assumes that the ray's origin is outside
    // the box, but the code below works even if the origin is inside the
    // box:
    //
    // Between one and three "frontfacing" sides of the box are oriented
    // towards the ray's origin, and between one and three "backfacing"
    // sides are oriented away from the ray's origin.
    // We intersect the ray with the planes that contain the sides of the
    // box, and compare the distances between the ray's origin and the
    // ray-plane intersections.  The ray intersects the box if the most
    // distant frontfacing intersection is nearer than the nearest
    // backfacing intersection.  If the ray does intersect the box, then
    // the most distant frontfacing ray-plane intersection is the entry
    // point and the nearest backfacing ray-plane intersection is the
    // exit point.
    //

    const T TMAX = std::numeric_limits<T>::max ();

    T tFrontMax = -TMAX;
    T tBackMin  = TMAX;

    //
    // Minimum and maximum X sides.
    //

    if (r.dir.x >= 0)
    {
        T d1 = b.max.x - r.pos.x;
        T d2 = b.min.x - r.pos.x;

        if (r.dir.x > 1 ||
            (abs (d1) < TMAX * r.dir.x && abs (d2) < TMAX * r.dir.x))
        {
            T t1 = d1 / r.dir.x;
            T t2 = d2 / r.dir.x;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = b.max.x;
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = b.min.x;
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.x < b.min.x || r.pos.x > b.max.x)
        {
            return false;
        }
    }
    else // r.dir.x < 0
    {
        T d1 = b.min.x - r.pos.x;
        T d2 = b.max.x - r.pos.x;

        if (r.dir.x < -1 ||
            (abs (d1) < -TMAX * r.dir.x && abs (d2) < -TMAX * r.dir.x))
        {
            T t1 = d1 / r.dir.x;
            T t2 = d2 / r.dir.x;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = b.min.x;
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = b.max.x;
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.x < b.min.x || r.pos.x > b.max.x)
        {
            return false;
        }
    }

    //
    // Minimum and maximum Y sides.
    //

    if (r.dir.y >= 0)
    {
        T d1 = b.max.y - r.pos.y;
        T d2 = b.min.y - r.pos.y;

        if (r.dir.y > 1 ||
            (abs (d1) < TMAX * r.dir.y && abs (d2) < TMAX * r.dir.y))
        {
            T t1 = d1 / r.dir.y;
            T t2 = d2 / r.dir.y;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = b.max.y;
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = b.min.y;
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.y < b.min.y || r.pos.y > b.max.y)
        {
            return false;
        }
    }
    else // r.dir.y < 0
    {
        T d1 = b.min.y - r.pos.y;
        T d2 = b.max.y - r.pos.y;

        if (r.dir.y < -1 ||
            (abs (d1) < -TMAX * r.dir.y && abs (d2) < -TMAX * r.dir.y))
        {
            T t1 = d1 / r.dir.y;
            T t2 = d2 / r.dir.y;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = b.min.y;
                exit.z = clamp (r.pos.z + t1 * r.dir.z, b.min.z, b.max.z);
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = b.max.y;
                entry.z = clamp (r.pos.z + t2 * r.dir.z, b.min.z, b.max.z);
            }
        }
        else if (r.pos.y < b.min.y || r.pos.y > b.max.y)
        {
            return false;
        }
    }

    //
    // Minimum and maximum Z sides.
    //

    if (r.dir.z >= 0)
    {
        T d1 = b.max.z - r.pos.z;
        T d2 = b.min.z - r.pos.z;

        if (r.dir.z > 1 ||
            (abs (d1) < TMAX * r.dir.z && abs (d2) < TMAX * r.dir.z))
        {
            T t1 = d1 / r.dir.z;
            T t2 = d2 / r.dir.z;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = b.max.z;
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = b.min.z;
            }
        }
        else if (r.pos.z < b.min.z || r.pos.z > b.max.z)
        {
            return false;
        }
    }
    else // r.dir.z < 0
    {
        T d1 = b.min.z - r.pos.z;
        T d2 = b.max.z - r.pos.z;

        if (r.dir.z < -1 ||
            (abs (d1) < -TMAX * r.dir.z && abs (d2) < -TMAX * r.dir.z))
        {
            T t1 = d1 / r.dir.z;
            T t2 = d2 / r.dir.z;

            if (tBackMin > t1)
            {
                tBackMin = t1;

                exit.x = clamp (r.pos.x + t1 * r.dir.x, b.min.x, b.max.x);
                exit.y = clamp (r.pos.y + t1 * r.dir.y, b.min.y, b.max.y);
                exit.z = b.min.z;
            }

            if (tFrontMax < t2)
            {
                tFrontMax = t2;

                entry.x = clamp (r.pos.x + t2 * r.dir.x, b.min.x, b.max.x);
                entry.y = clamp (r.pos.y + t2 * r.dir.y, b.min.y, b.max.y);
                entry.z = b.max.z;
            }
        }
        else if (r.pos.z < b.min.z || r.pos.z > b.max.z)
        {
            return false;
        }
    }

    return tFrontMax <= tBackMin;
}